

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeCommandListUpdateMutableCommandSignalEventExp
          (ze_command_list_handle_t hCommandList,uint64_t commandId,ze_event_handle_t hSignalEvent)

{
  code *UNRECOVERED_JUMPTABLE_00;
  ze_result_t zVar1;
  
  UNRECOVERED_JUMPTABLE_00 = *(code **)(*(long *)(hCommandList + 8) + 0x350);
  if (UNRECOVERED_JUMPTABLE_00 == (code *)0x0) {
    return ZE_RESULT_ERROR_UNINITIALIZED;
  }
  if (hSignalEvent != (ze_event_handle_t)0x0) {
    zVar1 = (*UNRECOVERED_JUMPTABLE_00)
                      (*(undefined8 *)hCommandList,commandId,*(undefined8 *)hSignalEvent);
    return zVar1;
  }
  zVar1 = (*UNRECOVERED_JUMPTABLE_00)(*(undefined8 *)hCommandList,commandId,0);
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListUpdateMutableCommandSignalEventExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint64_t commandId,                             ///< [in] command identifier
        ze_event_handle_t hSignalEvent                  ///< [in][optional] handle of the event to signal on completion
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnUpdateMutableCommandSignalEventExp = dditable->ze.CommandListExp.pfnUpdateMutableCommandSignalEventExp;
        if( nullptr == pfnUpdateMutableCommandSignalEventExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // forward to device-driver
        result = pfnUpdateMutableCommandSignalEventExp( hCommandList, commandId, hSignalEvent );

        return result;
    }